

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

bool __thiscall
ON_Mesh::ModifyNgon(ON_Mesh *this,uint ngon_index,uint Vcount,uint *ngon_vi,uint Fcount,
                   uint *ngon_fi)

{
  bool bVar1;
  undefined1 local_48 [7];
  bool rc;
  ON_MeshNgon ngon;
  uint *ngon_fi_local;
  uint Fcount_local;
  uint *ngon_vi_local;
  uint Vcount_local;
  uint ngon_index_local;
  ON_Mesh *this_local;
  
  local_48._0_4_ = Vcount;
  unique0x1000002d = Fcount;
  ngon._0_8_ = ngon_vi;
  ngon.m_vi = ngon_fi;
  ngon.m_fi = ngon_fi;
  bVar1 = ModifyNgon(this,ngon_index,(ON_MeshNgon *)local_48);
  return bVar1;
}

Assistant:

bool ON_Mesh::ModifyNgon(
  unsigned int ngon_index,
  unsigned int Vcount, 
  const unsigned int* ngon_vi,
  unsigned int Fcount, 
  const unsigned int* ngon_fi
  )
{
  ON_MeshNgon ngon;
  ngon.m_Vcount = Vcount;
  ngon.m_vi = (unsigned int*)ngon_vi;
  ngon.m_Fcount = Fcount;
  ngon.m_fi = (unsigned int*)ngon_fi;
  bool rc = ModifyNgon(ngon_index,&ngon);
  ngon.m_vi = 0;
  ngon.m_fi = 0;
  return rc;
}